

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall kratos::VarConcat::add_source(VarConcat *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  pointer ppVVar1;
  Var **var;
  pointer ppVVar2;
  
  ppVVar1 = (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar2 = (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar2 != ppVVar1; ppVVar2 = ppVVar2 + 1
      ) {
    (*((*ppVVar2)->super_IRNode)._vptr_IRNode[0x16])(*ppVVar2,stmt);
  }
  return;
}

Assistant:

void VarConcat::add_source(const std::shared_ptr<kratos::AssignStmt> &stmt) {
    for (auto &var : vars_) {
        var->add_source(stmt);
    }
}